

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_ipcdial.c
# Opt level: O2

int ipc_dialer_set_test_no_connect(void *arg,void *buf,size_t sz,nni_type t)

{
  ulong in_RAX;
  undefined8 uStack_28;
  _Bool no_connect;
  
  uStack_28 = in_RAX & 0xffffffffffffff;
  nni_copyin_bool((_Bool *)((long)&uStack_28 + 7),buf,sz,t);
  nni_mtx_lock((nni_mtx *)((long)arg + 0x60));
  *(undefined1 *)((long)arg + 0x128) = uStack_28._7_1_;
  nni_mtx_unlock((nni_mtx *)((long)arg + 0x60));
  return 0;
}

Assistant:

static int
ipc_dialer_set_test_no_connect(
    void *arg, const void *buf, size_t sz, nni_type t)
{
	ipc_dialer *d          = arg;
	bool        no_connect = false;

	(void) nni_copyin_bool(&no_connect, buf, sz, t);
	nni_mtx_lock(&d->mtx);
	d->no_connect = no_connect;
	nni_mtx_unlock(&d->mtx);
	return (0);
}